

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::MultiTexShader::MultiTexShader
          (MultiTexShader *this,deUint32 randSeed,int numUnits,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *unitTypes)

{
  vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_> *this_00;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_01;
  uint uVar1;
  pointer puVar2;
  char *pcVar3;
  int iVar4;
  deUint32 dVar5;
  int unitNdx;
  long lVar6;
  char *__rhs;
  int i;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float __x;
  string samplersStr;
  undefined4 uStack_478;
  string samplerName;
  string ndxStr;
  string transformationName;
  Random rnd;
  string samplerName_1;
  string colorMultiplier;
  string transformationName_1;
  Matrix<float,_3,_3> local_320;
  Matrix<float,_3,_3> local_2f8;
  string lookupCoord;
  Matrix<float,_3,_3> local_2a8;
  Matrix<float,_3,_3> local_280;
  Matrix<float,_3,_3> local_258;
  Matrix<float,_3,_3> local_230;
  Matrix<float,_3,_3> local_208;
  Matrix<float,_3,_3> local_1e0;
  float planarTransData [9];
  Matrix<float,_3,_3> local_a0;
  Matrix<float,_3,_3> local_78;
  Matrix<float,_3,_3> local_54;
  
  puVar2 = (unitTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)planarTransData);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&samplerName,"a_position",(allocator<char> *)&transformationName);
  std::__cxx11::string::string((string *)&samplersStr,(string *)&samplerName);
  stack0xfffffffffffffb84 = (ulong)(uint)samplersStr.field_2._12_4_;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)planarTransData,(VertexAttribute *)&samplersStr);
  std::__cxx11::string::~string((string *)&samplersStr);
  std::__cxx11::string::~string((string *)&samplerName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&samplerName,"a_coord",(allocator<char> *)&transformationName);
  std::__cxx11::string::string((string *)&samplersStr,(string *)&samplerName);
  stack0xfffffffffffffb84 = stack0xfffffffffffffb84 & 0xffffffff;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)planarTransData,(VertexAttribute *)&samplersStr);
  std::__cxx11::string::~string((string *)&samplersStr);
  std::__cxx11::string::~string((string *)&samplerName);
  samplersStr._M_dataplus._M_p = (pointer)((ulong)samplersStr._M_dataplus._M_p._5_3_ << 0x28);
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)planarTransData,(VertexToFragmentVarying *)&samplersStr);
  samplersStr._M_dataplus._M_p = samplersStr._M_dataplus._M_p & 0xffffffff00000000;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)planarTransData,(FragmentOutput *)&samplersStr);
  iVar4 = 0;
  while (colorMultiplier._M_dataplus._M_p._0_4_ = iVar4, iVar4 < numUnits) {
    de::toString<int>(&samplersStr,(int *)&colorMultiplier);
    std::operator+(&samplerName,"u_sampler",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&samplersStr
                  );
    std::__cxx11::string::~string((string *)&samplersStr);
    de::toString<int>(&samplersStr,(int *)&colorMultiplier);
    std::operator+(&transformationName,"u_trans",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&samplersStr
                  );
    std::__cxx11::string::~string((string *)&samplersStr);
    uVar1 = puVar2[(int)colorMultiplier._M_dataplus._M_p];
    std::__cxx11::string::string((string *)&samplersStr,(string *)&samplerName);
    stack0xfffffffffffffb84 =
         (ulong)CONCAT14(uVar1 == 0xde1,samplersStr.field_2._12_4_) ^ 0x2900000000;
    sglr::pdec::ShaderProgramDeclaration::operator<<
              ((ShaderProgramDeclaration *)planarTransData,(Uniform *)&samplersStr);
    std::__cxx11::string::~string((string *)&samplersStr);
    std::__cxx11::string::string((string *)&samplersStr,(string *)&transformationName);
    stack0xfffffffffffffb84 = CONCAT44(9,samplersStr.field_2._12_4_);
    sglr::pdec::ShaderProgramDeclaration::operator<<
              ((ShaderProgramDeclaration *)planarTransData,(Uniform *)&samplersStr);
    std::__cxx11::string::~string((string *)&samplersStr);
    std::__cxx11::string::~string((string *)&transformationName);
    std::__cxx11::string::~string((string *)&samplerName);
    iVar4 = (int)colorMultiplier._M_dataplus._M_p + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&samplerName,
             "attribute highp vec4 a_position;\nattribute mediump vec2 a_coord;\nvarying mediump vec2 v_coord;\n\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,(allocator<char> *)&transformationName);
  std::__cxx11::string::string((string *)&samplersStr,(string *)&samplerName);
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)planarTransData,(VertexSource *)&samplersStr);
  std::__cxx11::string::~string((string *)&samplersStr);
  std::__cxx11::string::~string((string *)&samplerName);
  samplersStr._M_dataplus._M_p = (pointer)&samplersStr.field_2;
  samplersStr._M_string_length = 0;
  samplersStr.field_2._M_allocated_capacity._0_4_ =
       samplersStr.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  samplerName._M_dataplus._M_p = (pointer)&samplerName.field_2;
  samplerName._M_string_length._0_4_ = 0;
  samplerName._M_string_length._4_4_ = 0;
  samplerName.field_2._M_allocated_capacity._0_4_ =
       samplerName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  transformationName._M_dataplus._M_p = (pointer)&transformationName.field_2;
  transformationName._M_string_length = 0;
  transformationName.field_2._M_allocated_capacity =
       transformationName.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_54.m_data.m_data[0].m_data[0] = (float)numUnits;
  de::toString<int>(&samplerName_1,(int *)&local_54);
  std::operator+(&ndxStr,"(1.0/",&samplerName_1);
  std::operator+(&colorMultiplier,&ndxStr,".0)");
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::~string((string *)&samplerName_1);
  for (rnd.m_rnd.x = 0; (int)rnd.m_rnd.x < (int)local_54.m_data.m_data[0].m_data[0];
      rnd.m_rnd.x = rnd.m_rnd.x + 1) {
    de::toString<int>(&ndxStr,(int *)&rnd);
    std::operator+(&samplerName_1,"u_sampler",&ndxStr);
    std::operator+(&transformationName_1,"u_trans",&ndxStr);
    pcVar3 = "textureGrad - samplerCube";
    if (puVar2[(int)rnd.m_rnd.x] == 0xde1) {
      pcVar3 = "textureGrad - sampler2D";
    }
    __rhs = "textureCube";
    if (puVar2[(int)rnd.m_rnd.x] == 0xde1) {
      __rhs = "texture2D";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280,
                   "uniform mediump ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258,
                   pcVar3 + 0xe);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a8,
                   " ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320,
                   &samplerName_1);
    std::operator+(&lookupCoord,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8,
                   ";\n");
    std::__cxx11::string::append((string *)&samplersStr);
    std::__cxx11::string::~string((string *)&lookupCoord);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_280);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8,
                   "uniform mediump mat3 ",&transformationName_1);
    std::operator+(&lookupCoord,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8,
                   ";\n");
    std::__cxx11::string::append((string *)&samplerName);
    std::__cxx11::string::~string((string *)&lookupCoord);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::operator+(&lookupCoord,&transformationName_1,"*vec3(v_coord, 1.0)");
    if (puVar2[(int)rnd.m_rnd.x] == 0xde1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320
                     ,"vec2(",&lookupCoord);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_320,")");
      std::__cxx11::string::operator=((string *)&lookupCoord,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_320);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0,
                   "\tcolor += ",&colorMultiplier);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0,
                   "*");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
                   __rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                   "(");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280,
                   &samplerName_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258,
                   ", ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a8,
                   &lookupCoord);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320,
                   ");\n");
    std::__cxx11::string::append((string *)&transformationName);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&lookupCoord);
    std::__cxx11::string::~string((string *)&transformationName_1);
    std::__cxx11::string::~string((string *)&samplerName_1);
    std::__cxx11::string::~string((string *)&ndxStr);
  }
  std::operator+(&transformationName_1,&samplersStr,&samplerName);
  std::operator+(&samplerName_1,&transformationName_1,
                 "varying mediump vec2 v_coord;\n\nvoid main (void)\n{\n\tmediump vec4 color = vec4(0.0);\n"
                );
  std::operator+(&ndxStr,&samplerName_1,&transformationName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230,
                 &ndxStr,"\tgl_FragColor = color;\n}\n");
  std::__cxx11::string::~string((string *)&ndxStr);
  std::__cxx11::string::~string((string *)&samplerName_1);
  std::__cxx11::string::~string((string *)&transformationName_1);
  std::__cxx11::string::~string((string *)&colorMultiplier);
  std::__cxx11::string::~string((string *)&transformationName);
  std::__cxx11::string::~string((string *)&samplerName);
  std::__cxx11::string::~string((string *)&samplersStr);
  std::__cxx11::string::string((string *)&local_208,(string *)&local_230);
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)planarTransData,(FragmentSource *)&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_230);
  sglr::ShaderProgram::ShaderProgram
            (&this->super_ShaderProgram,(ShaderProgramDeclaration *)planarTransData);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)planarTransData);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e1d298;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e1d2d0;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e1d2e8;
  *(int *)&(this->super_ShaderProgram).field_0x154 = numUnits;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_unitTypes,unitTypes);
  this_00 = &this->m_transformations;
  this_01 = &this->m_lodDerivateParts;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  deRandom_init(&rnd.m_rnd,randSeed);
  std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::reserve
            (this_00,(long)*(int *)&(this->super_ShaderProgram).field_0x154);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
            (this_01,(long)*(int *)&(this->super_ShaderProgram).field_0x154);
  for (lVar6 = 0; lVar6 < *(int *)&(this->super_ShaderProgram).field_0x154; lVar6 = lVar6 + 1) {
    if ((this->m_unitTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6] == 0xde1) {
      fVar8 = deRandom_getFloat(&rnd.m_rnd);
      fVar9 = deRandom_getFloat(&rnd.m_rnd);
      fVar10 = deRandom_getFloat(&rnd.m_rnd);
      fVar11 = deRandom_getFloat(&rnd.m_rnd);
      fVar12 = deRandom_getFloat(&rnd.m_rnd);
      fVar13 = deRandom_getFloat(&rnd.m_rnd);
      fVar14 = deRandom_getFloat(&rnd.m_rnd);
      __x = fVar8 * 6.2831855 + 0.0;
      planarTransData[6] = 0.0;
      planarTransData[7] = 0.0;
      planarTransData[0] = 1.0;
      planarTransData[1] = 0.0;
      planarTransData[2] = -0.5;
      planarTransData[3] = 0.0;
      planarTransData[4] = 1.0;
      planarTransData[5] = -0.5;
      planarTransData[8] = 1.0;
      fVar8 = cosf(__x);
      samplersStr._M_dataplus._M_p._0_4_ = fVar8;
      fVar8 = sinf(__x);
      samplersStr._M_dataplus._M_p =
           (pointer)(CONCAT44(fVar8,samplersStr._M_dataplus._M_p._0_4_) ^ 0x8000000000000000);
      samplersStr._M_string_length = samplersStr._M_string_length & 0xffffffff00000000;
      fVar8 = sinf(__x);
      samplersStr._M_string_length = CONCAT44(fVar8,(undefined4)samplersStr._M_string_length);
      samplersStr.field_2._M_allocated_capacity._0_4_ = cosf(__x);
      samplerName._M_dataplus._M_p._4_4_ = 0;
      samplerName._M_string_length._0_4_ = 0;
      samplersStr.field_2._4_8_ = 0;
      stack0xfffffffffffffb84 = 0x3f80000000000000;
      samplerName._M_string_length._4_4_ = 0;
      samplerName.field_2._4_8_ = 0;
      stack0xfffffffffffffbb4 = 0x3f80000000000000;
      transformationName._M_dataplus._M_p._4_4_ = fVar11 * 0.5 + 0.0;
      transformationName._M_dataplus._M_p._0_4_ = 0x3f800000;
      transformationName._M_string_length = 0;
      transformationName.field_2._M_allocated_capacity = 0x3f800000;
      transformationName.field_2._8_8_ = 0;
      colorMultiplier._M_dataplus._M_p = (pointer)0x3f800000;
      colorMultiplier._M_string_length._0_4_ = 0;
      colorMultiplier.field_2._M_allocated_capacity = 0x3f800000;
      colorMultiplier.field_2._8_8_ = 0;
      ndxStr._M_dataplus._M_p = (pointer)0x3f800000;
      ndxStr._12_8_ = 0x3f80000000000000;
      ndxStr.field_2._8_8_ = 0;
      samplerName._M_dataplus._M_p._0_4_ = fVar9 * 0.8 + 0.7;
      samplerName.field_2._M_allocated_capacity._0_4_ = fVar10 * 0.8 + 0.7;
      ndxStr._M_string_length._0_4_ = fVar13 + -0.5;
      ndxStr.field_2._M_allocated_capacity._4_4_ = fVar14 + -0.5;
      colorMultiplier._M_string_length._4_4_ = fVar12 * 0.5 + 0.0;
      tcu::Matrix<float,_3,_3>::Matrix(&local_258,planarTransData);
      tcu::Matrix<float,_3,_3>::Matrix(&local_280,(float *)&ndxStr);
      tcu::operator*(&local_2a8,&local_258,&local_280);
      tcu::Matrix<float,_3,_3>::Matrix(&local_78,(float *)&samplersStr);
      tcu::operator*(&local_320,&local_2a8,&local_78);
      tcu::Matrix<float,_3,_3>::Matrix(&local_a0,(float *)&samplerName);
      tcu::operator*(&local_2f8,&local_320,&local_a0);
      tcu::Matrix<float,_3,_3>::Matrix(&local_1e0,(float *)&transformationName);
      tcu::operator*((Matrix<float,_3,_3> *)&lookupCoord,&local_2f8,&local_1e0);
      tcu::Matrix<float,_3,_3>::Matrix(&local_208,(float *)&colorMultiplier);
      tcu::operator*((Matrix<float,_3,_3> *)&transformationName_1,
                     (Matrix<float,_3,_3> *)&lookupCoord,&local_208);
      tcu::Matrix<float,_3,_3>::Matrix(&local_54,planarTransData);
      tcu::operator*(&local_230,&local_54,-1.0);
      tcu::operator*((Matrix<float,_3,_3> *)&samplerName_1,
                     (Matrix<float,_3,_3> *)&transformationName_1,&local_230);
      calculateLodDerivateParts((Functional *)&transformationName_1,(Mat3 *)&samplerName_1);
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)this_01,
                 (Vector<float,_4> *)&transformationName_1);
      std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::push_back
                (this_00,(value_type *)&samplerName_1);
    }
    else {
      for (uVar7 = 0; uVar7 != 9; uVar7 = uVar7 + 1) {
        if ((uVar7 & 0xb) == 0) {
          fVar8 = deRandom_getFloat(&rnd.m_rnd);
          planarTransData[uVar7] = fVar8 * 0.79999995 + 0.1;
        }
        else if (uVar7 == 8) {
          planarTransData[8] = 1.0;
        }
        else {
          planarTransData[uVar7] = 0.0;
        }
      }
      dVar5 = deRandom_getUint32(&rnd.m_rnd);
      tcu::Matrix<float,_3,_3>::Matrix((Matrix<float,_3,_3> *)&samplersStr,planarTransData);
      tcu::Matrix<float,_3,_3>::Matrix
                ((Matrix<float,_3,_3> *)&transformationName,
                 MultiTexShader::s_cubeTransforms[(ulong)dVar5 % 6]);
      tcu::operator*((Matrix<float,_3,_3> *)&samplerName,(Matrix<float,_3,_3> *)&transformationName,
                     (Matrix<float,_3,_3> *)&samplersStr);
      calculateLodDerivateParts((Functional *)&transformationName,(Mat3 *)&samplersStr);
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)this_01,
                 (Vector<float,_4> *)&transformationName);
      std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::push_back
                (this_00,(value_type *)&samplerName);
    }
  }
  return;
}

Assistant:

MultiTexShader::MultiTexShader (deUint32 randSeed, int numUnits, const vector<GLenum>& unitTypes)
	: sglr::ShaderProgram	(generateShaderProgramDeclaration(numUnits, &unitTypes[0]))
	, m_numUnits			(numUnits)
	, m_unitTypes			(unitTypes)
{
	// 2d-to-cube-face transformations.
	// \note 2d coordinates range from 0 to 1 and cube face coordinates from -1 to 1, so scaling is done as well.
	static const float s_cubeTransforms[][3*3] =
	{
		// Face -X: (x, y, 1) -> (-1, -(2*y-1), +(2*x-1))
		{  0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   2.0f,  0.0f, -1.0f },
		// Face +X: (x, y, 1) -> (+1, -(2*y-1), -(2*x-1))
		{  0.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		  -2.0f,  0.0f,  1.0f },
		// Face -Y: (x, y, 1) -> (+(2*x-1), -1, -(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f },
		// Face +Y: (x, y, 1) -> (+(2*x-1), +1, +(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f,  1.0f,
		   0.0f,  2.0f, -1.0f },
		// Face -Z: (x, y, 1) -> (-(2*x-1), -(2*y-1), -1)
		{ -2.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f, -1.0f },
		// Face +Z: (x, y, 1) -> (+(2*x-1), -(2*y-1), +1)
		{  2.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f,  1.0f }
	};

	// Generate transformation matrices.

	de::Random rnd(randSeed);

	m_transformations.reserve(m_numUnits);
	m_lodDerivateParts.reserve(m_numUnits);

	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		if (m_unitTypes[unitNdx] == GL_TEXTURE_2D)
		{
			float rotAngle				= rnd.getFloat(0.0f, 2.0f*DE_PI);
			float xScaleFactor			= rnd.getFloat(0.7f, 1.5f);
			float yScaleFactor			= rnd.getFloat(0.7f, 1.5f);
			float xShearAmount			= rnd.getFloat(0.0f, 0.5f);
			float yShearAmount			= rnd.getFloat(0.0f, 0.5f);
			float xTranslationAmount	= rnd.getFloat(-0.5f, 0.5f);
			float yTranslationAmount	= rnd.getFloat(-0.5f, 0.5f);

			float tempOffsetData[3*3] = // For temporarily centering the coordinates to get nicer transformations.
			{
				1.0f,  0.0f, -0.5f,
				0.0f,  1.0f, -0.5f,
				0.0f,  0.0f,  1.0f
			};
			float rotTransfData[3*3] =
			{
				deFloatCos(rotAngle),	-deFloatSin(rotAngle),	0.0f,
				deFloatSin(rotAngle),	deFloatCos(rotAngle),	0.0f,
				0.0f,					0.0f,					1.0f
			};
			float scaleTransfData[3*3] =
			{
				xScaleFactor,	0.0f,			0.0f,
				0.0f,			yScaleFactor,	0.0f,
				0.0f,			0.0f,			1.0f
			};
			float xShearTransfData[3*3] =
			{
				1.0f,			xShearAmount,	0.0f,
				0.0f,			1.0f,			0.0f,
				0.0f,			0.0f,			1.0f
			};
			float yShearTransfData[3*3] =
			{
				1.0f,			0.0f,			0.0f,
				yShearAmount,	1.0f,			0.0f,
				0.0f,			0.0f,			1.0f
			};
			float translationTransfData[3*3] =
			{
				1.0f,	0.0f,	xTranslationAmount,
				0.0f,	1.0f,	yTranslationAmount,
				0.0f,	0.0f,	1.0f
			};

			Mat3 transformation =
				Mat3(tempOffsetData) *
				Mat3(translationTransfData) *
				Mat3(rotTransfData) *
				Mat3(scaleTransfData) *
				Mat3(xShearTransfData) *
				Mat3(yShearTransfData) *
				(Mat3(tempOffsetData) * (-1.0f));

			// Calculate parts of lod derivates.
			m_lodDerivateParts.push_back(calculateLodDerivateParts(transformation));

			m_transformations.push_back(transformation);
		}
		else
		{
			DE_ASSERT(m_unitTypes[unitNdx] == GL_TEXTURE_CUBE_MAP);
			DE_STATIC_ASSERT((int)tcu::CUBEFACE_LAST == DE_LENGTH_OF_ARRAY(s_cubeTransforms));

			float planarTransData[3*3];

			// In case of a cube map, we only want to render one face, so the transformation needs to be restricted - only enlarging scaling is done.

			for (int i = 0; i < DE_LENGTH_OF_ARRAY(planarTransData); i++)
			{
				if (i == 0 || i == 4)
					planarTransData[i] = rnd.getFloat(0.1f, 0.9f); // Two first diagonal cells control the scaling.
				else if (i == 8)
					planarTransData[i] = 1.0f;
				else
					planarTransData[i] = 0.0f;
			}

			int		faceNdx			= rnd.getInt(0, (int)tcu::CUBEFACE_LAST - 1);
			Mat3	planarTrans		(planarTransData);									// Planar, face-agnostic transformation.
			Mat3	finalTrans		= Mat3(s_cubeTransforms[faceNdx]) * planarTrans;	// Final transformation from planar to cube map coordinates, including the transformation just generated.

			// Calculate parts of lod derivates.
			m_lodDerivateParts.push_back(calculateLodDerivateParts(planarTrans));

			m_transformations.push_back(finalTrans);
		}
	}
}